

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_cpp.cpp
# Opt level: O0

string * __thiscall
flatbuffers::cpp::CppGenerator::GetNestedFlatBufferName_abi_cxx11_
          (string *__return_storage_ptr__,CppGenerator *this,FieldDef *field)

{
  Value *pVVar1;
  string local_a8;
  StructDef *local_88;
  StructDef *nested_root;
  string qualified_name;
  allocator<char> local_49;
  string local_48;
  Value *local_28;
  Value *nested;
  FieldDef *field_local;
  CppGenerator *this_local;
  
  nested = (Value *)field;
  field_local = (FieldDef *)this;
  this_local = (CppGenerator *)__return_storage_ptr__;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_48,"nested_flatbuffer",&local_49);
  pVVar1 = SymbolTable<flatbuffers::Value>::Lookup(&(field->super_Definition).attributes,&local_48);
  std::__cxx11::string::~string((string *)&local_48);
  std::allocator<char>::~allocator(&local_49);
  local_28 = pVVar1;
  if (pVVar1 == (Value *)0x0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"",
               (allocator<char> *)(qualified_name.field_2._M_local_buf + 0xb));
    std::allocator<char>::~allocator((allocator<char> *)(qualified_name.field_2._M_local_buf + 0xb))
    ;
  }
  else {
    std::__cxx11::string::string((string *)&nested_root,(string *)&pVVar1->constant);
    local_88 = Parser::LookupStruct((this->super_BaseGenerator).parser_,&local_28->constant);
    if (local_88 == (StructDef *)0x0) {
      Namespace::GetFullyQualifiedName
                (&local_a8,((this->super_BaseGenerator).parser_)->current_namespace_,
                 &local_28->constant,1000);
      std::__cxx11::string::operator=((string *)&nested_root,(string *)&local_a8);
      std::__cxx11::string::~string((string *)&local_a8);
      local_88 = Parser::LookupStruct((this->super_BaseGenerator).parser_,(string *)&nested_root);
    }
    if (local_88 == (StructDef *)0x0) {
      __assert_fail("nested_root",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/src/idl_gen_cpp.cpp"
                    ,0xae5,
                    "std::string flatbuffers::cpp::CppGenerator::GetNestedFlatBufferName(const FieldDef &)"
                   );
    }
    TranslateNameSpace(__return_storage_ptr__,(string *)&nested_root);
    std::__cxx11::string::~string((string *)&nested_root);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string GetNestedFlatBufferName(const FieldDef &field) {
    auto nested = field.attributes.Lookup("nested_flatbuffer");
    if (!nested) return "";
    std::string qualified_name = nested->constant;
    auto nested_root = parser_.LookupStruct(nested->constant);
    if (nested_root == nullptr) {
      qualified_name =
          parser_.current_namespace_->GetFullyQualifiedName(nested->constant);
      nested_root = parser_.LookupStruct(qualified_name);
    }
    FLATBUFFERS_ASSERT(nested_root);  // Guaranteed to exist by parser.
    (void)nested_root;
    return TranslateNameSpace(qualified_name);
  }